

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsplugin.cpp
# Opt level: O0

void AGS_EngineStartup(IAGSEngine *lpEngine)

{
  IAGSEngine *lpEngine_local;
  
  AGSSockAPI::engine = lpEngine;
  if (*(long *)(lpEngine + 8) < 0x12) {
    (*(code *)**(undefined8 **)lpEngine)(lpEngine,"Plugin needs engine version 18 or newer.");
  }
  AGSSockAPI::Initialize();
  AGSSock::Initialize();
  (**(code **)(*(long *)AGSSockAPI::engine + 0x228))
            (AGSSockAPI::engine,"SockData",&PTR_DAT_00124d20);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::Create^2",AGSSock::SockData_Create);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::CreateEmpty^0",AGSSock::SockData_CreateEmpty);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::CreateFromString^1",AGSSock::SockData_CreateFromString);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::get_Size",AGSSock::SockData_get_Size);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::set_Size",AGSSock::SockData_set_Size);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::geti_Chars",AGSSock::SockData_geti_Chars);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::seti_Chars",AGSSock::SockData_seti_Chars);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::AsString^0",AGSSock::SockData_AsString);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockData::Clear^0",AGSSock::SockData_Clear);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x228))
            (AGSSockAPI::engine,"SockAddr",&PTR_DAT_00124d30);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::Create^1",AGSSock::SockAddr_Create);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::CreateFromString^2",AGSSock::SockAddr_CreateFromString);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::CreateFromData^1",AGSSock::SockAddr_CreateFromData);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::CreateIP^2",AGSSock::SockAddr_CreateIP);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::CreateIPv6^2",AGSSock::SockAddr_CreateIPv6);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::get_Port",AGSSock::SockAddr_get_Port);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::set_Port",AGSSock::SockAddr_set_Port);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::get_Address",AGSSock::SockAddr_get_Address);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::set_Address",AGSSock::SockAddr_set_Address);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::get_IP",AGSSock::SockAddr_get_IP);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::set_IP",AGSSock::SockAddr_set_IP);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"SockAddr::GetData^0",AGSSock::SockAddr_GetData);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x228))(AGSSockAPI::engine,"Socket",&PTR_DAT_00124d40);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Create^3",AGSSock::Socket_Create);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::CreateUDP^0",AGSSock::Socket_CreateUDP);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::CreateTCP^0",AGSSock::Socket_CreateTCP);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::CreateUDPv6^0",AGSSock::Socket_CreateUDPv6);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::CreateTCPv6^0",AGSSock::Socket_CreateTCPv6);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::get_Tag",AGSSock::Socket_get_Tag);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::set_Tag",AGSSock::Socket_set_Tag);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::get_Local",AGSSock::Socket_get_Local);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::get_Remote",AGSSock::Socket_get_Remote);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::get_Valid",AGSSock::Socket_get_Valid);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::ErrorValue^0",AGSSock::Socket_ErrorValue);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::ErrorString^0",AGSSock::Socket_ErrorString);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Bind^1",AGSSock::Socket_Bind);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Listen^1",AGSSock::Socket_Listen);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Connect^2",AGSSock::Socket_Connect);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Accept^0",AGSSock::Socket_Accept);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Close^0",AGSSock::Socket_Close);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Send^1",AGSSock::Socket_Send);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::SendTo^2",AGSSock::Socket_SendTo);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::Recv^0",AGSSock::Socket_Recv);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::RecvFrom^1",AGSSock::Socket_RecvFrom);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::SendData^1",AGSSock::Socket_SendData);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::SendDataTo^2",AGSSock::Socket_SendDataTo);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::RecvData^0",AGSSock::Socket_RecvData);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::RecvDataFrom^1",AGSSock::Socket_RecvDataFrom);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::GetOption^2",AGSSock::Socket_GetOption);
  (**(code **)(*(long *)AGSSockAPI::engine + 0x10))
            (AGSSockAPI::engine,"Socket::SetOption^3",AGSSock::Socket_SetOption);
  return;
}

Assistant:

void AGS_EngineStartup(IAGSEngine *lpEngine)
{
	using namespace AGSSockAPI;
	
	engine = lpEngine;
	
	// Make sure it's got the version with the features we need
	if (engine->version < MIN_ENGINE_VERSION)
		engine->AbortGame("Plugin needs engine version " STRINGIFY(MIN_ENGINE_VERSION) " or newer.");
	
	AGSSockAPI::Initialize();
	AGSSock::Initialize();
	
	// Register functions
	SOCKDATA_ENTRY
	SOCKADDR_ENTRY
	SOCKET_ENTRY
}